

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

opj_tgt_tree_t * opj_tgt_create(OPJ_UINT32 numleafsh,OPJ_UINT32 numleafsv,opj_event_mgr_t *manager)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  opj_tgt_node_t *poVar4;
  uint local_158;
  OPJ_UINT32 n;
  OPJ_UINT32 numlvls;
  OPJ_INT32 k;
  OPJ_INT32 j;
  OPJ_UINT32 i;
  opj_tgt_tree_t *tree;
  opj_tgt_node_t *l_parent_node0;
  opj_tgt_node_t *l_parent_node;
  opj_tgt_node_t *node;
  OPJ_INT32 nplv [32];
  OPJ_INT32 nplh [32];
  opj_event_mgr_t *manager_local;
  OPJ_UINT32 numleafsv_local;
  OPJ_UINT32 numleafsh_local;
  
  _numleafsv_local = (opj_tgt_tree_t *)opj_calloc(1,0x20);
  if (_numleafsv_local == (opj_tgt_tree_t *)0x0) {
    opj_event_msg(manager,1,"Not enough memory to create Tag-tree\n");
    _numleafsv_local = (opj_tgt_tree_t *)0x0;
  }
  else {
    _numleafsv_local->numleafsh = numleafsh;
    _numleafsv_local->numleafsv = numleafsv;
    local_158 = 0;
    nplv[0x1e] = numleafsh;
    _numleafsv_local->numnodes = 0;
    uVar3 = local_158;
    do {
      local_158 = uVar3;
      iVar1 = nplv[(ulong)local_158 + 0x1e];
      iVar2 = nplv[(ulong)local_158 - 2];
      nplv[(ulong)(local_158 + 1) + 0x1e] = (nplv[(ulong)local_158 + 0x1e] + 1) / 2;
      nplv[(ulong)(local_158 + 1) - 2] = (nplv[(ulong)local_158 - 2] + 1) / 2;
      _numleafsv_local->numnodes = iVar1 * iVar2 + _numleafsv_local->numnodes;
      uVar3 = local_158 + 1;
    } while (1 < (uint)(iVar1 * iVar2));
    if (_numleafsv_local->numnodes == 0) {
      opj_free(_numleafsv_local);
      opj_event_msg(manager,2,"tgt_create tree->numnodes == 0, no tree created.\n");
      _numleafsv_local = (opj_tgt_tree_t *)0x0;
    }
    else {
      poVar4 = (opj_tgt_node_t *)opj_calloc((ulong)_numleafsv_local->numnodes,0x18);
      _numleafsv_local->nodes = poVar4;
      if (_numleafsv_local->nodes == (opj_tgt_node_t *)0x0) {
        opj_event_msg(manager,1,"Not enough memory to create Tag-tree nodes\n");
        opj_free(_numleafsv_local);
        _numleafsv_local = (opj_tgt_tree_t *)0x0;
      }
      else {
        _numleafsv_local->nodes_size = _numleafsv_local->numnodes * 0x18;
        l_parent_node = _numleafsv_local->nodes;
        tree = (opj_tgt_tree_t *)
               (_numleafsv_local->nodes + _numleafsv_local->numleafsh * _numleafsv_local->numleafsv)
        ;
        l_parent_node0 = (opj_tgt_node_t *)tree;
        for (k = 0; (uint)k < local_158; k = k + 1) {
          for (numlvls = 0; (int)numlvls < nplv[(ulong)(uint)k - 2]; numlvls = numlvls + 1) {
            n = nplv[(ulong)(uint)k + 0x1e];
            while (-1 < (int)(n - 1)) {
              l_parent_node->parent = l_parent_node0;
              n = n - 2;
              poVar4 = l_parent_node + 1;
              if (-1 < (int)n) {
                l_parent_node[1].parent = l_parent_node0;
                poVar4 = l_parent_node + 2;
              }
              l_parent_node = poVar4;
              l_parent_node0 = l_parent_node0 + 1;
            }
            if (((numlvls & 1) == 0) && (numlvls != nplv[(ulong)(uint)k - 2] - 1U)) {
              l_parent_node0 = (opj_tgt_node_t *)tree;
              tree = (opj_tgt_tree_t *)(&tree->numleafsh + (long)nplv[(ulong)(uint)k + 0x1e] * 6);
            }
            else {
              tree = (opj_tgt_tree_t *)l_parent_node0;
            }
          }
        }
        l_parent_node->parent = (opj_tgt_node *)0x0;
        opj_tgt_reset(_numleafsv_local);
      }
    }
  }
  return _numleafsv_local;
}

Assistant:

opj_tgt_tree_t *opj_tgt_create(OPJ_UINT32 numleafsh, OPJ_UINT32 numleafsv, opj_event_mgr_t *manager) {
        OPJ_INT32 nplh[32];
        OPJ_INT32 nplv[32];
        opj_tgt_node_t *node = 00;
        opj_tgt_node_t *l_parent_node = 00;
        opj_tgt_node_t *l_parent_node0 = 00;
        opj_tgt_tree_t *tree = 00;
        OPJ_UINT32 i;
        OPJ_INT32  j,k;
        OPJ_UINT32 numlvls;
        OPJ_UINT32 n;

        tree = (opj_tgt_tree_t *) opj_calloc(1,sizeof(opj_tgt_tree_t));
        if(!tree) {
                opj_event_msg(manager, EVT_ERROR, "Not enough memory to create Tag-tree\n");
                return 00;
        }

        tree->numleafsh = numleafsh;
        tree->numleafsv = numleafsv;

        numlvls = 0;
        nplh[0] = (OPJ_INT32)numleafsh;
        nplv[0] = (OPJ_INT32)numleafsv;
        tree->numnodes = 0;
        do {
                n = (OPJ_UINT32)(nplh[numlvls] * nplv[numlvls]);
                nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
                nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
                tree->numnodes += n;
                ++numlvls;
        } while (n > 1);

        /* ADD */
        if (tree->numnodes == 0) {
                opj_free(tree);
                opj_event_msg(manager, EVT_WARNING, "tgt_create tree->numnodes == 0, no tree created.\n");
                return 00;
        }

        tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
        if(!tree->nodes) {
                opj_event_msg(manager, EVT_ERROR, "Not enough memory to create Tag-tree nodes\n");
                opj_free(tree);
                return 00;
        }
        tree->nodes_size = tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

        node = tree->nodes;
        l_parent_node = &tree->nodes[tree->numleafsh * tree->numleafsv];
        l_parent_node0 = l_parent_node;

        for (i = 0; i < numlvls - 1; ++i) {
                for (j = 0; j < nplv[i]; ++j) {
                        k = nplh[i];
                        while (--k >= 0) {
                                node->parent = l_parent_node;
                                ++node;
                                if (--k >= 0) {
                                        node->parent = l_parent_node;
                                        ++node;
                                }
                                ++l_parent_node;
                        }
                        if ((j & 1) || j == nplv[i] - 1) {
                                l_parent_node0 = l_parent_node;
                        } else {
                                l_parent_node = l_parent_node0;
                                l_parent_node0 += nplh[i];
                        }
                }
        }
        node->parent = 0;
        opj_tgt_reset(tree);
        return tree;
}